

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasIOS13Features(Model *model)

{
  bool bVar1;
  TypeCase TVar2;
  uint32 uVar3;
  Pipeline *pPVar4;
  RepeatedPtrField<CoreML::Specification::Model> *pRVar5;
  reference pMVar6;
  PipelineRegressor *this;
  PipelineClassifier *this_00;
  TextClassifier *this_01;
  Gazetteer *this_02;
  WordEmbedding *this_03;
  bool local_87;
  bool local_86;
  bool local_85;
  Model *m_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_2;
  Model *m_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_1;
  Model *m;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2;
  bool result;
  Model *model_local;
  
  bVar1 = Specification::Model::isupdatable(model);
  if (bVar1) {
    return true;
  }
  __range2._7_1_ = false;
  TVar2 = Specification::Model::Type_case(model);
  if (TVar2 == kPipelineClassifier) {
    this_00 = Specification::Model::pipelineclassifier(model);
    pPVar4 = Specification::PipelineClassifier::pipeline(this_00);
    pRVar5 = Specification::Pipeline::models(pPVar4);
    __end2_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar5);
    m_2 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar5);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_2,(iterator *)&m_2), bVar1) {
      pMVar6 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_2);
      local_87 = true;
      if (__range2._7_1_ == false) {
        local_87 = hasIOS13Features(pMVar6);
      }
      __range2._7_1_ = local_87;
      if (local_87 != false) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_2);
    }
  }
  else if (TVar2 == kPipelineRegressor) {
    this = Specification::Model::pipelineregressor(model);
    pPVar4 = Specification::PipelineRegressor::pipeline(this);
    pRVar5 = Specification::Pipeline::models(pPVar4);
    __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar5);
    m_1 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar5);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_1,(iterator *)&m_1), bVar1) {
      pMVar6 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_1);
      local_86 = true;
      if (__range2._7_1_ == false) {
        local_86 = hasIOS13Features(pMVar6);
      }
      __range2._7_1_ = local_86;
      if (local_86 != false) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_1);
    }
  }
  else {
    if (TVar2 != kPipeline) {
      if (TVar2 != kKNearestNeighborsClassifier) {
        if (TVar2 == kItemSimilarityRecommender) {
          bVar1 = hasItemSimilarityRecommender(model);
          return bVar1;
        }
        if (TVar2 != kLinkedModel) {
          if (TVar2 == kTextClassifier) {
            this_01 = Specification::Model::textclassifier(model);
            uVar3 = Specification::CoreMLModels::TextClassifier::revision(this_01);
            return uVar3 == 2;
          }
          if (TVar2 == kSoundAnalysisPreprocessing) {
            bVar1 = hasSoundAnalysisPreprocessing(model);
            return bVar1;
          }
          if (TVar2 == kGazetteer) {
            this_02 = Specification::Model::gazetteer(model);
            uVar3 = Specification::CoreMLModels::Gazetteer::revision(this_02);
            return uVar3 == 2;
          }
          if (TVar2 != kWordEmbedding) {
            bVar1 = hasIOS13NeuralNetworkFeatures(model);
            return bVar1;
          }
          this_03 = Specification::Model::wordembedding(model);
          uVar3 = Specification::CoreMLModels::WordEmbedding::revision(this_03);
          return uVar3 == 2;
        }
      }
      return true;
    }
    pPVar4 = Specification::Model::pipeline(model);
    pRVar5 = Specification::Pipeline::models(pPVar4);
    __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar5);
    m = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar5);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2,(iterator *)&m), bVar1) {
      pMVar6 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2);
      local_85 = true;
      if (__range2._7_1_ == false) {
        local_85 = hasIOS13Features(pMVar6);
      }
      __range2._7_1_ = local_85;
      if (local_85 != false) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2);
    }
  }
  return false;
}

Assistant:

bool CoreML::hasIOS13Features(const Specification::Model& model) {
    // New IOS13 features:
    // - no constraint on rank for NN inputs
    // - model is marked as updatable
    // - model parameters are specified
    // - model is of type kKNearestNeighborsClassifier
    // - model is of sound analysis preprocessing
    // - model is of type LinkedModel
    // - model is of type TextClassifier with revision == 2
    // - model is of type Gazetteer
    // - model is of type WordEmbedding
    // - (... add others here ...)

    if (model.isupdatable()) {
        return true;
    }

    bool result = false;
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                result = result || hasIOS13Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                result = result ||hasIOS13Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                result = result || hasIOS13Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kKNearestNeighborsClassifier:
        case Specification::Model::kLinkedModel:
            return true;
        case Specification::Model::kItemSimilarityRecommender:
            return hasItemSimilarityRecommender(model);
        case Specification::Model::kSoundAnalysisPreprocessing:
            return hasSoundAnalysisPreprocessing(model);
        case Specification::Model::kTextClassifier:
            return model.textclassifier().revision() == 2;
        case Specification::Model::kGazetteer:
            return model.gazetteer().revision() == 2;
        case Specification::Model::kWordEmbedding:
            return model.wordembedding().revision() == 2;
        default:
            return hasIOS13NeuralNetworkFeatures(model);
    }
    return false;
}